

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglBufferAgeTests.cpp
# Opt level: O0

bool deqp::egl::anon_unknown_0::compareToReference
               (TestLog *log,Surface *reference,Surface *buffer,int frameNdx,int bufferNum)

{
  bool bVar1;
  ostream *poVar2;
  char *imageSetDesc;
  Vector<int,_3> local_23c;
  Vector<unsigned_int,_4> local_230;
  ConstPixelBufferAccess local_220;
  ConstPixelBufferAccess local_1f8;
  string local_1d0 [48];
  ostringstream local_1a0 [8];
  ostringstream stream;
  int bufferNum_local;
  int frameNdx_local;
  Surface *buffer_local;
  Surface *reference_local;
  TestLog *log_local;
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  poVar2 = std::operator<<((ostream *)local_1a0,"FrameNdx = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,frameNdx);
  poVar2 = std::operator<<(poVar2,", compare current buffer (numbered: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,bufferNum);
  std::operator<<(poVar2,") to reference");
  std::__cxx11::ostringstream::str();
  imageSetDesc = (char *)std::__cxx11::string::c_str();
  tcu::Surface::getAccess(&local_1f8,reference);
  tcu::Surface::getAccess(&local_220,buffer);
  tcu::Vector<unsigned_int,_4>::Vector(&local_230,8,8,8,0);
  tcu::Vector<int,_3>::Vector(&local_23c,2,2,0);
  bVar1 = tcu::intThresholdPositionDeviationCompare
                    (log,"partial update test",imageSetDesc,&local_1f8,&local_220,&local_230,
                     &local_23c,true,COMPARE_LOG_RESULT);
  std::__cxx11::string::~string(local_1d0);
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return bVar1;
}

Assistant:

bool compareToReference (tcu::TestLog& log,	 const tcu::Surface& reference, const tcu::Surface& buffer, int frameNdx, int bufferNum)
{
	std::ostringstream stream;
	stream << "FrameNdx = " << frameNdx << ", compare current buffer (numbered: " << bufferNum << ") to reference";
	return tcu::intThresholdPositionDeviationCompare(log, "buffer age test", stream.str().c_str(), reference.getAccess(), buffer.getAccess(),
													 tcu::UVec4(8, 8, 8, 0), tcu::IVec3(2,2,0), true, tcu::COMPARE_LOG_RESULT);
}